

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O2

bool fs_is_fifo(string_view path)

{
  bool bVar1;
  bool bVar2;
  error_code ec;
  string_view path_local;
  path local_40;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&path_local,auto_format);
  bVar1 = std::filesystem::is_fifo(&local_40,&ec);
  bVar2 = ec._M_value == 0;
  std::filesystem::__cxx11::path::~path(&local_40);
  return bVar1 && bVar2;
}

Assistant:

bool
fs_is_fifo(std::string_view path)
{
  // mkfifo() or CreateNamedPipe()
  bool ok;

#if defined(_WIN32)
  ok = fs_win32_is_type(path, FILE_TYPE_PIPE);
#elif defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = std::filesystem::is_fifo(path, ec) && !ec;
#else
  ok = S_ISFIFO(fs_st_mode(path));
#endif

  return ok;
}